

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

void __thiscall Heap<SAT::VarOrderLt>::insert(Heap<SAT::VarOrderLt> *this,int n)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  int *piVar6;
  double *pdVar7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int local_20;
  uint local_1c;
  
  local_20 = -1;
  local_1c = n;
  vec<int>::growTo(&this->indices,n + 1,&local_20);
  (this->indices).data[(uint)n] = (this->heap).sz;
  vec<int>::push(&this->heap,(int *)&local_1c);
  puVar5 = (uint *)(this->heap).data;
  piVar6 = (this->indices).data;
  uVar11 = (ulong)(uint)piVar6[local_1c];
  uVar3 = puVar5[uVar11];
  if (uVar11 == 0) {
    puVar9 = puVar5;
    uVar10 = 0;
  }
  else {
    pdVar7 = ((this->lt).activity)->data;
    dVar2 = pdVar7[uVar3];
    do {
      uVar8 = (uint)uVar11;
      uVar12 = (int)(uVar8 - 1) >> 1;
      uVar4 = puVar5[uVar12];
      pdVar1 = pdVar7 + uVar4;
      puVar9 = puVar5 + uVar11;
      uVar10 = uVar8;
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
      puVar5[uVar11] = uVar4;
      piVar6[uVar4] = uVar8;
      puVar9 = puVar5;
      uVar11 = (ulong)uVar12;
      uVar10 = uVar12;
    } while (1 < uVar8 - 1);
  }
  *puVar9 = uVar3;
  piVar6[uVar3] = uVar10;
  return;
}

Assistant:

void insert(int n) {
		indices.growTo(n + 1, -1);
		assert(!inHeap(n));

		indices[n] = heap.size();
		heap.push(n);
		percolateUp(indices[n]);
	}